

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

uint32 google::protobuf::compiler::cpp::anon_unknown_0::GenChunkMask
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *fields,vector<int,_std::allocator<int>_> *has_bit_indices)

{
  bool bVar1;
  const_reference ppFVar2;
  char *pcVar3;
  const_reference pvVar4;
  reference ppFVar5;
  LogMessage *this;
  int __c;
  int __c_00;
  LogMessage *in_RSI;
  FieldDescriptor ***__s;
  undefined8 in_RDI;
  int index;
  FieldDescriptor *field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  uint32 chunk_mask;
  int first_index_offset;
  LogMessage *in_stack_fffffffffffffea8;
  LogMessage *pLVar6;
  LogMessage *in_stack_fffffffffffffeb0;
  undefined1 *in_stack_fffffffffffffeb8;
  LogMessage *in_stack_fffffffffffffec0;
  LogMessage local_108;
  byte local_c9;
  undefined1 local_c8 [60];
  int local_8c;
  FieldDescriptor *local_88;
  FieldDescriptor **local_80;
  __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_78;
  undefined8 local_70;
  uint local_68;
  int local_64;
  byte local_49;
  LogMessage *local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)in_stack_fffffffffffffec0);
  local_49 = 0;
  if (bVar1) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffec0,(LogLevel)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (char *)in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    local_49 = 1;
    in_RSI = internal::LogMessage::operator<<
                       (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x5081f4);
  }
  pLVar6 = local_10;
  ppFVar2 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::front((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)in_stack_fffffffffffffeb0);
  pcVar3 = FieldDescriptor::index(*ppFVar2,(char *)in_RSI,__c);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)pLVar6,(long)(int)pcVar3);
  local_64 = *pvVar4 / 0x20;
  local_68 = 0;
  local_70 = local_8;
  local_78._M_current =
       (FieldDescriptor **)
       std::
       vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)in_stack_fffffffffffffea8);
  local_80 = (FieldDescriptor **)
             std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)in_stack_fffffffffffffea8);
  while( true ) {
    __s = &local_80;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar1) break;
    ppFVar5 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&local_78);
    pLVar6 = local_10;
    local_88 = *ppFVar5;
    pcVar3 = FieldDescriptor::index(local_88,(char *)__s,__c_00);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)pLVar6,(long)(int)pcVar3);
    local_8c = *pvVar4;
    local_c9 = 0;
    if (local_64 != local_8c / 0x20) {
      in_stack_fffffffffffffeb8 = local_c8;
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffec0,(LogLevel)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                 (char *)in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
      local_c9 = 1;
      in_stack_fffffffffffffec0 =
           internal::LogMessage::operator<<
                     (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
    if ((local_c9 & 1) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)0x50837f);
    }
    local_68 = 1 << ((byte)((long)local_8c % 0x20) & 0x1f) | local_68;
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&local_78);
  }
  if (local_68 == 0) {
    pLVar6 = &local_108;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffec0,(LogLevel)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (char *)in_stack_fffffffffffffeb0,(int)((ulong)pLVar6 >> 0x20));
    this = internal::LogMessage::operator<<(in_stack_fffffffffffffeb0,(char *)pLVar6);
    internal::LogFinisher::operator=((LogFinisher *)this,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)0x508490);
  }
  return local_68;
}

Assistant:

uint32 GenChunkMask(const std::vector<const FieldDescriptor*>& fields,
                    const std::vector<int>& has_bit_indices) {
  GOOGLE_CHECK(!fields.empty());
  int first_index_offset = has_bit_indices[fields.front()->index()] / 32;
  uint32 chunk_mask = 0;
  for (auto field : fields) {
    // "index" defines where in the _has_bits_ the field appears.
    int index = has_bit_indices[field->index()];
    GOOGLE_CHECK_EQ(first_index_offset, index / 32);
    chunk_mask |= static_cast<uint32>(1) << (index % 32);
  }
  GOOGLE_CHECK_NE(0, chunk_mask);
  return chunk_mask;
}